

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O1

void __thiscall slang::ast::UnrollVisitor::handle(UnrollVisitor *this,ExpressionStatement *stmt)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_> *this_00
  ;
  undefined4 uVar3;
  AssignmentExpression *pAVar4;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *__ptr;
  undefined8 *puVar7;
  int iVar8;
  undefined1 auVar9 [16];
  ushort uVar10;
  undefined8 *puVar11;
  ulong uVar12;
  bool bVar13;
  pointer __p;
  ulong pos0;
  long *plVar14;
  undefined8 *puVar15;
  uint uVar16;
  pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *ppVar17;
  ulong hash;
  long lVar18;
  undefined8 uVar19;
  ulong uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  undefined1 auVar25 [16];
  locator res;
  try_emplace_args_t local_89;
  AssignmentExpression *local_88;
  flat_hash_map<const_AssignmentExpression_*,_std::unique_ptr<SmallVector<PerAssignDriverState>_>_>
  *local_80;
  _Storage<std::pair<unsigned_long,_unsigned_long>,_true> local_78;
  long local_68;
  pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> local_60 [2];
  ulong local_40;
  ulong local_38;
  
  if ((this->anyErrors != false) ||
     (bVar13 = EvalContext::step(&this->evalCtx,(SourceLocation)0xffffffffffffffff), !bVar13)) {
    this->anyErrors = true;
  }
  pAVar4 = (AssignmentExpression *)stmt->expr;
  if ((pAVar4->super_Expression).kind == Assignment) {
    local_80 = &this->driverMap;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = pAVar4;
    hash = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->driverMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
                          .arrays.groups_size_index & 0x3f);
    pgVar5 = (this->driverMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
             .arrays.groups_;
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ppVar6 = (this->driverMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
             .arrays.elements_;
    local_40 = (this->driverMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
               .arrays.groups_size_mask;
    uVar12 = 0;
    uVar20 = pos0;
    do {
      local_38 = uVar12;
      pgVar2 = pgVar5 + uVar20;
      uVar21 = (uchar)uVar3;
      auVar25[0] = -(pgVar2->m[0].n == uVar21);
      uVar22 = (uchar)((uint)uVar3 >> 8);
      auVar25[1] = -(pgVar2->m[1].n == uVar22);
      uVar23 = (uchar)((uint)uVar3 >> 0x10);
      auVar25[2] = -(pgVar2->m[2].n == uVar23);
      uVar24 = (uchar)((uint)uVar3 >> 0x18);
      auVar25[3] = -(pgVar2->m[3].n == uVar24);
      auVar25[4] = -(pgVar2->m[4].n == uVar21);
      auVar25[5] = -(pgVar2->m[5].n == uVar22);
      auVar25[6] = -(pgVar2->m[6].n == uVar23);
      auVar25[7] = -(pgVar2->m[7].n == uVar24);
      auVar25[8] = -(pgVar2->m[8].n == uVar21);
      auVar25[9] = -(pgVar2->m[9].n == uVar22);
      auVar25[10] = -(pgVar2->m[10].n == uVar23);
      auVar25[0xb] = -(pgVar2->m[0xb].n == uVar24);
      auVar25[0xc] = -(pgVar2->m[0xc].n == uVar21);
      auVar25[0xd] = -(pgVar2->m[0xd].n == uVar22);
      auVar25[0xe] = -(pgVar2->m[0xe].n == uVar23);
      auVar25[0xf] = -(pgVar2->m[0xf].n == uVar24);
      uVar10 = (ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe;
      if (uVar10 != 0) {
        uVar16 = (uint)uVar10;
        do {
          iVar8 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
            }
          }
          if (pAVar4 == *(AssignmentExpression **)
                         ((long)&ppVar6[uVar20 * 0xf].first + (ulong)(uint)(iVar8 << 4))) {
            lVar18 = (long)&ppVar6[uVar20 * 0xf].first + (ulong)(uint)(iVar8 << 4);
            goto LAB_004f070a;
          }
          uVar16 = uVar16 - 1 & uVar16;
        } while (uVar16 != 0);
      }
      if ((pgVar5[uVar20].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
      uVar20 = uVar20 + local_38 + 1 & local_40;
      uVar12 = local_38 + 1;
    } while (local_38 + 1 <= local_40);
    lVar18 = 0;
LAB_004f070a:
    local_88 = pAVar4;
    if (lVar18 == 0) {
      if ((this->driverMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
          .size_ctrl.size <
          (this->driverMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::AssignmentExpression_const*>
                  ((locator *)&local_78._M_value,
                   (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
                    *)local_80,(arrays_type *)local_80,pos0,hash,&local_89,&local_88);
        psVar1 = &(this->driverMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState>_>_>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
        lVar18 = local_68;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::AssignmentExpression_const*>
                  ((locator *)&local_78._M_value,
                   (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
                    *)local_80,hash,&local_89,&local_88);
        lVar18 = local_68;
      }
    }
    this_00 = (default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>
               *)(lVar18 + 8);
    if (*(long *)(lVar18 + 8) == 0) {
      plVar14 = (long *)operator_new(0x1d8);
      *plVar14 = (long)(plVar14 + 3);
      plVar14[1] = 0;
      plVar14[2] = 2;
      local_78._M_value.first = 0;
      __ptr = *(SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> **)this_00;
      *(long **)this_00 = plVar14;
      if (__ptr != (SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *)0x0) {
        std::
        default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>::
        operator()(this_00,__ptr);
      }
      if ((SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *)
          local_78._M_value.first !=
          (SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *)0x0) {
        std::
        default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>::
        operator()((default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>
                    *)&local_78._M_value,
                   (SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *)
                   local_78._M_value.first);
      }
    }
    if (this->setupMode == true) {
      local_78._M_value.second = 0;
      local_68 = 2;
      local_78._M_value.first = (unsigned_long)local_60;
      Expression::getLongestStaticPrefixes
                (pAVar4->left_,
                 (SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
                  *)&local_78._M_value,&this->evalCtx,(Expression *)0x0);
      if (local_78._M_value.second != 0) {
        ppVar17 = (pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *)
                  (local_78._M_value.second * 0x10 + local_78._M_value.first);
        uVar19 = local_78._M_value.first;
        do {
          SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>::
          emplace_back<slang::ast::Expression_const&,slang::ast::ValueSymbol_const&>
                    (*(SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState> **)this_00,
                     ((pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *)
                     uVar19)->second,
                     ((pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *)
                     uVar19)->first);
          uVar19 = uVar19 + 0x10;
        } while ((pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *)uVar19 !=
                 ppVar17);
      }
      if ((pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *)
          local_78._M_value.first != local_60) {
        operator_delete((void *)local_78._M_value.first);
      }
    }
    else {
      lVar18 = (*(long **)this_00)[1];
      if (lVar18 != 0) {
        puVar7 = (undefined8 *)**(long **)this_00;
        puVar11 = puVar7;
        do {
          ValueDriver::getBounds
                    ((optional<std::pair<unsigned_long,_unsigned_long>_> *)&local_78._M_value,
                     (Expression *)*puVar11,&this->evalCtx,(Type *)puVar11[2]);
          if ((char)local_68 == '\x01') {
            IntervalMap<unsigned_long,_std::monostate,_0U>::unionWith
                      ((IntervalMap<unsigned_long,_std::monostate,_0U> *)(puVar11 + 3),
                       local_78._M_value.first,local_78._M_value.second,(monostate *)&local_88,
                       &this->comp->unrollIntervalMapAllocator);
          }
          puVar15 = puVar11 + 0x1c;
          puVar11 = puVar11 + 0x1c;
        } while (puVar15 != puVar7 + lVar18 * 0x1c);
      }
    }
  }
  return;
}

Assistant:

void handle(const ExpressionStatement& stmt) {
        step();
        if (stmt.expr.kind != ExpressionKind::Assignment)
            return;

        auto& assign = stmt.expr.as<AssignmentExpression>();
        auto& driverState = driverMap[&assign];
        if (!driverState)
            driverState = std::make_unique<SmallVector<PerAssignDriverState>>();

        if (setupMode) {
            SmallVector<std::pair<const ValueSymbol*, const Expression*>> prefixes;
            assign.left().getLongestStaticPrefixes(prefixes, evalCtx);

            for (auto [symbol, expr] : prefixes)
                driverState->emplace_back(*expr, *symbol);
        }
        else {
            for (auto& state : *driverState) {
                auto bounds = ValueDriver::getBounds(*state.longestStaticPrefix, evalCtx,
                                                     *state.rootType);
                if (bounds) {
                    state.intervals.unionWith(*bounds, {}, comp.getUnrollIntervalMapAllocator());
                }
            }
        }
    }